

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<unsigned_long,unsigned_long,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
               (unsigned_long *ldata,unsigned_long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t i;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      result_data[iVar4] = -ldata[iVar4];
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar6 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar7 = count;
        }
LAB_007cff8f:
        for (; uVar3 = uVar6, uVar6 < uVar7; uVar6 = uVar6 + 1) {
          result_data[uVar6] = -ldata[uVar6];
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar7 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar7 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_007cff8f;
        uVar3 = uVar7;
        if (uVar2 != 0) {
          for (uVar8 = 0; uVar3 = uVar6 + uVar8, uVar6 + uVar8 < uVar7; uVar8 = uVar8 + 1) {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              result_data[uVar6 + uVar8] = -ldata[uVar6 + uVar8];
            }
          }
        }
      }
      uVar6 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}